

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

RecyclableObject *
Js::JavascriptArray::ObjectSpliceHelper<unsigned_int>
          (RecyclableObject *pObj,uint len,uint start,uint deleteLen,Var *insertArgs,
          uint32 insertLen,ScriptContext *scriptContext,RecyclableObject *pNewObj)

{
  undefined8 uVar1;
  bool bVar2;
  BOOL BVar3;
  JavascriptArray *pJVar4;
  JavascriptCopyOnAccessNativeIntArray *this;
  Var pvVar5;
  ThreadContext *extraout_RAX;
  undefined1 auVar6 [8];
  undefined4 in_register_0000000c;
  ScriptContext *pSVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  uint32 index;
  uint32 uVar11;
  uint32 index_00;
  BigIndex index_01;
  BigIndex idxDest;
  BigIndex local_b8;
  Var *local_a8;
  JavascriptArray *local_a0;
  JavascriptArray *local_98;
  undefined8 local_90;
  ulong local_88;
  ulong local_80;
  undefined1 local_78 [8];
  BigIndex k;
  undefined1 local_60 [8];
  JsReentLock jsReentLock;
  
  jsReentLock._28_4_ = in_register_0000000c;
  jsReentLock._24_4_ = deleteLen;
  local_60 = (undefined1  [8])scriptContext->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)local_60)->noJsReentrancy;
  ((ThreadContext *)local_60)->noJsReentrancy = true;
  local_a8 = insertArgs;
  k.bigIndex._4_4_ = len;
  JsReentLock::setObjectForMutation((JsReentLock *)local_60,pObj);
  if (pNewObj == (RecyclableObject *)0x0) {
    *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    insertArgs = (Var *)0x0;
    pNewObj = ArraySpeciesCreate<unsigned_int>
                        (pObj,jsReentLock._24_4_,scriptContext,(bool *)0x0,(bool *)0x0,(bool *)0x0);
    *(bool *)((long)local_60 + 0x108) = true;
    if (((JavascriptArray *)pNewObj == (JavascriptArray *)0x0) &&
       (pNewObj = (RecyclableObject *)
                  JavascriptLibrary::CreateArray
                            ((scriptContext->super_ScriptContextBase).javascriptLibrary,
                             jsReentLock._24_4_),
       (((JavascriptArray *)pNewObj)->head).ptr == EmptySegment)) {
      AllocateHead<void*>((JavascriptArray *)pNewObj);
    }
  }
  bVar2 = IsNonES5Array(pNewObj);
  local_a0 = (JavascriptArray *)pNewObj;
  local_88 = (ulong)start;
  local_80 = (ulong)insertLen;
  if ((bVar2) &&
     (pJVar4 = UnsafeVarTo<Js::JavascriptArray>(pNewObj), pJVar4 != (JavascriptArray *)0x0)) {
    bVar2 = VarIs<Js::JavascriptCopyOnAccessNativeIntArray>(pJVar4);
    if ((bVar2) &&
       (this = UnsafeVarTo<Js::JavascriptCopyOnAccessNativeIntArray>(pJVar4),
       this != (JavascriptCopyOnAccessNativeIntArray *)0x0)) {
      JavascriptCopyOnAccessNativeIntArray::ConvertCopyOnAccessSegment(this);
    }
    JsReentLock::setSecondObjectForMutation((JsReentLock *)local_60,pJVar4);
    local_90 = 0;
    local_98 = pJVar4;
    if (jsReentLock._24_4_ != 0) {
      uVar9 = 0;
      do {
        *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        uVar11 = (int)local_88 + uVar9;
        BVar3 = JavascriptOperators::HasItem(pObj,uVar11);
        JsReentLock::MutateArrayObject((JsReentLock *)local_60);
        *(bool *)((long)local_60 + 0x108) = true;
        if (BVar3 != 0) {
          *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
          pvVar5 = JavascriptOperators::GetItem(pObj,uVar11,scriptContext);
          JsReentLock::MutateArrayObject((JsReentLock *)local_60);
          *(bool *)((long)local_60 + 0x108) = true;
          (*(local_98->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
            super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
                    (local_98,(ulong)uVar9,pvVar5,0);
        }
        uVar9 = uVar9 + 1;
      } while (jsReentLock._24_4_ != uVar9);
      insertLen = (uint32)local_80;
      start = (uint)local_88;
    }
    local_90 = 0;
  }
  else {
    BigIndex::BigIndex((BigIndex *)local_78,0);
    auVar6 = (undefined1  [8])extraout_RAX;
    if (jsReentLock._24_4_ != 0) {
      uVar10 = local_88 & 0xffffffff;
      uVar8 = jsReentLock._24_8_ & 0xffffffff;
      do {
        *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        uVar11 = (uint32)uVar10;
        BVar3 = JavascriptOperators::HasItem(pObj,uVar11);
        JsReentLock::MutateArrayObject((JsReentLock *)local_60);
        *(bool *)((long)local_60 + 0x108) = true;
        if (BVar3 != 0) {
          *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
          pvVar5 = JavascriptOperators::GetItem(pObj,uVar11,scriptContext);
          idxDest.bigIndex = (uint64)pvVar5;
          idxDest.index = k.index;
          idxDest._4_4_ = k._4_4_;
          uVar9 = SetArrayLikeObjects(local_a0,(RecyclableObject *)(ulong)(uint)local_78._0_4_,
                                      idxDest,insertArgs);
          index_01.bigIndex = (uint64)insertArgs;
          index_01.index = k.index;
          index_01._4_4_ = k._4_4_;
          ThrowErrorOnFailure((JavascriptArray *)(ulong)uVar9,(BOOL)scriptContext,
                              (ScriptContext *)(ulong)(uint)local_78._0_4_,index_01);
          JsReentLock::MutateArrayObject((JsReentLock *)local_60);
          *(bool *)((long)local_60 + 0x108) = true;
        }
        if (local_78._0_4_ == 0xffffffff) {
          k._0_8_ = k._0_8_ + 1;
        }
        else {
          local_78._0_4_ = local_78._0_4_ + 1;
        }
        uVar10 = (ulong)(uVar11 + 1);
        uVar9 = (int)uVar8 - 1;
        uVar8 = (ulong)uVar9;
        auVar6 = local_60;
      } while (uVar9 != 0);
    }
    local_90 = CONCAT71((int7)((ulong)auVar6 >> 8),1);
    local_98 = (JavascriptArray *)0x0;
    insertLen = (uint32)local_80;
    start = (uint)local_88;
  }
  uVar11 = k.bigIndex._4_4_;
  if ((uint)jsReentLock._24_4_ < insertLen) {
    *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    BigIndex::BigIndex((BigIndex *)local_78,start + insertLen);
    Unshift<Js::JavascriptArray::BigIndex,unsigned_int>
              (pObj,(BigIndex *)local_78,jsReentLock._24_4_ + start,uVar11,scriptContext);
    JsReentLock::MutateArrayObject((JsReentLock *)local_60);
    *(bool *)((long)local_60 + 0x108) = true;
  }
  else {
    if (insertLen < (uint)jsReentLock._24_4_) {
      index_00 = jsReentLock._24_4_ + start;
      if (index_00 < k.bigIndex._4_4_) {
        index = start + insertLen;
        do {
          *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
          BVar3 = JavascriptOperators::HasItem(pObj,index_00);
          JsReentLock::MutateArrayObject((JsReentLock *)local_60);
          *(bool *)((long)local_60 + 0x108) = true;
          *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
          if (BVar3 == 0) {
            BVar3 = JavascriptOperators::DeleteItem
                              (pObj,index,PropertyOperation_ThrowOnDeleteIfNotConfig);
            if (BVar3 == 0) {
              JavascriptError::ThrowTypeError(scriptContext,-0x7ff5fe43,L"Array.prototype.splice");
            }
            JsReentLock::MutateArrayObject((JsReentLock *)local_60);
          }
          else {
            pvVar5 = JavascriptOperators::GetItem(pObj,index_00,scriptContext);
            BVar3 = JavascriptOperators::SetItem
                              (pObj,pObj,index,pvVar5,scriptContext,
                               PropertyOperation_ThrowIfNotExtensible,0);
            if (BVar3 == 0) {
              JavascriptError::ThrowTypeError(scriptContext,-0x7ff5fe43,L"Array.prototype.splice");
            }
            JsReentLock::MutateArrayObject((JsReentLock *)local_60);
          }
          *(bool *)((long)local_60 + 0x108) = true;
          index_00 = index_00 + 1;
          index = index + 1;
        } while (index_00 < uVar11);
      }
      insertLen = (uint32)local_80;
      uVar9 = (uVar11 - jsReentLock._24_4_) + insertLen;
      if (uVar9 < uVar11) {
        do {
          *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
          uVar11 = uVar11 - 1;
          BVar3 = JavascriptOperators::DeleteItem
                            (pObj,uVar11,PropertyOperation_ThrowOnDeleteIfNotConfig);
          if (BVar3 == 0) {
            JavascriptError::ThrowTypeError(scriptContext,-0x7ff5fe43,L"Array.prototype.splice");
          }
          JsReentLock::MutateArrayObject((JsReentLock *)local_60);
          *(bool *)((long)local_60 + 0x108) = true;
        } while (uVar9 < uVar11);
      }
    }
    start = (uint)local_88;
    if (insertLen == 0) goto LAB_00b91fe6;
  }
  uVar10 = local_80 & 0xffffffff;
  uVar8 = 0;
  do {
    *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    BigIndex::BigIndex((BigIndex *)local_78,start + (int)uVar8);
    BVar3 = BigIndex::SetItem((BigIndex *)local_78,pObj,local_a8[uVar8],
                              PropertyOperation_ThrowIfNotExtensible);
    if (BVar3 == 0) {
      JavascriptError::ThrowTypeError(scriptContext,-0x7ff5fe43,L"Array.prototype.splice");
    }
    JsReentLock::MutateArrayObject((JsReentLock *)local_60);
    *(bool *)((long)local_60 + 0x108) = true;
    uVar8 = uVar8 + 1;
  } while (uVar10 != uVar8);
LAB_00b91fe6:
  uVar9 = (k.bigIndex._4_4_ - jsReentLock._24_4_) + (int)local_80;
  pSVar7 = (ScriptContext *)(ulong)uVar9;
  *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  BigIndex::BigIndex((BigIndex *)local_78,uVar9);
  pvVar5 = BigIndex::ToNumber((BigIndex *)local_78,pSVar7);
  BVar3 = JavascriptOperators::SetProperty
                    (pObj,pObj,0xd1,pvVar5,scriptContext,PropertyOperation_ThrowIfNotExtensible);
  uVar1 = local_90;
  pJVar4 = local_a0;
  if (BVar3 == 0) {
    JavascriptError::ThrowTypeError(scriptContext,-0x7ff5fe43,L"Array.prototype.splice");
  }
  pSVar7 = (ScriptContext *)jsReentLock._24_8_;
  BigIndex::BigIndex(&local_b8,jsReentLock._24_4_);
  pvVar5 = BigIndex::ToNumber(&local_b8,pSVar7);
  BVar3 = JavascriptOperators::SetProperty
                    (pJVar4,(RecyclableObject *)pJVar4,0xd1,pvVar5,scriptContext,
                     PropertyOperation_ThrowIfNotExtensible);
  if (BVar3 == 0) {
    JavascriptError::ThrowTypeError(scriptContext,-0x7ff5fe43,L"Array.prototype.splice");
  }
  JsReentLock::MutateArrayObject((JsReentLock *)local_60);
  *(bool *)((long)local_60 + 0x108) = true;
  if ((char)uVar1 == '\0') {
    (*(local_98->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x74])();
  }
  ((ThreadContext *)local_60)->noJsReentrancy = (bool)jsReentLock.m_arrayObject2._0_1_;
  return (RecyclableObject *)pJVar4;
}

Assistant:

RecyclableObject* JavascriptArray::ObjectSpliceHelper(RecyclableObject* pObj, T len, T start,
        T deleteLen, Var* insertArgs, uint32 insertLen, ScriptContext *scriptContext, RecyclableObject* pNewObj)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, pObj);

        JavascriptArray *pnewArr = nullptr;

        if (pNewObj == nullptr)
        {
            JS_REENTRANT_NO_MUTATE(jsReentLock, pNewObj = ArraySpeciesCreate(pObj, deleteLen, scriptContext));
            if (pNewObj == nullptr)
            {
                if (deleteLen > UINT_MAX)
                {
                    JavascriptError::ThrowRangeError(scriptContext, JSERR_ArrayLengthConstructIncorrect);
                }

                pnewArr = scriptContext->GetLibrary()->CreateArray(static_cast<uint32>(deleteLen));
                pnewArr->EnsureHead<Var>();

                pNewObj = pnewArr;
            }
        }

        pnewArr = JavascriptArray::TryVarToNonES5Array(pNewObj);
        if (pnewArr)
        {
#if ENABLE_COPYONACCESS_ARRAY
            JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(pnewArr);
#endif
            SET_SECOND_OBJECT_FOR_MUTATION(jsReentLock, pnewArr);
        }

        // copy elements to delete to new array
        if (pnewArr != nullptr)
        {
            for (uint32 i = 0; i < deleteLen; i++)
            {
                JS_REENTRANT(jsReentLock, BOOL hasItem = JavascriptOperators::HasItem(pObj, start + i));
                if (hasItem)
                {
                    JS_REENTRANT(jsReentLock, Var element = JavascriptOperators::GetItem(pObj, start + i, scriptContext));
                    pnewArr->SetItem(i, element, PropertyOperation_None);
                }
            }
        }
        else
        {
            BigIndex k = 0u;
            for (T i = 0u; i < deleteLen; i++)
            {
                JS_REENTRANT(jsReentLock, BOOL hasItem = JavascriptOperators::HasItem(pObj, start + i));
                if (hasItem)
                {
                    Var element = nullptr;
                    JS_REENTRANT(jsReentLock, element = JavascriptOperators::GetItem(pObj, start + i, scriptContext),
                        ThrowErrorOnFailure(JavascriptArray::SetArrayLikeObjects(pNewObj, k, element), scriptContext, k));
                }
                ++k;
            }
        }

        ThrowTypeErrorOnFailureHelper h(scriptContext, _u("Array.prototype.splice"));

        // Now we need reserve room if it is necessary
        if (insertLen > deleteLen) // Might overflow max array length
        {
            // Unshift [start + deleteLen, len) to start + insertLen
            JS_REENTRANT(jsReentLock, Unshift<BigIndex, T>(pObj, start + insertLen, start + deleteLen, len, scriptContext));
        }
        else if (insertLen < deleteLen) // Won't overflow max array length
        {
            T j = 0;
            for (T i = start + deleteLen; i < len; i++)
            {
                JS_REENTRANT(jsReentLock, BOOL hasItem = JavascriptOperators::HasItem(pObj, i));
                if (hasItem)
                {
                    Var element = nullptr;
                    JS_REENTRANT(jsReentLock, element = JavascriptOperators::GetItem(pObj, i, scriptContext),
                        h.ThrowTypeErrorOnFailure(JavascriptOperators::SetItem(pObj, pObj, start + insertLen + j, element, scriptContext, PropertyOperation_ThrowIfNotExtensible)));
                }
                else
                {
                    JS_REENTRANT(jsReentLock,
                        h.ThrowTypeErrorOnFailure(JavascriptOperators::DeleteItem(pObj, start + insertLen + j, PropertyOperation_ThrowOnDeleteIfNotConfig)));
                }
                j++;
            }

            // Clean up the rest
            for (T i = len; i > len - deleteLen + insertLen; i--)
            {
                JS_REENTRANT(jsReentLock, h.ThrowTypeErrorOnFailure(JavascriptOperators::DeleteItem(pObj, i - 1, PropertyOperation_ThrowOnDeleteIfNotConfig)));
            }
        }

        if (insertLen > 0)
        {
            T dstIndex = start; // insert index might overflow max array length
            for (uint32 i = 0; i < insertLen; i++)
            {
                JS_REENTRANT(jsReentLock,
                    h.ThrowTypeErrorOnFailure(IndexTrace<BigIndex>::SetItem(pObj, dstIndex, insertArgs[i], PropertyOperation_ThrowIfNotExtensible)));
                ++dstIndex;
            }
        }

        // Set up new length
        T newLen = T(len - deleteLen) + insertLen;
        JS_REENTRANT(jsReentLock,
            h.ThrowTypeErrorOnFailure(JavascriptOperators::SetProperty(pObj, pObj, PropertyIds::length, IndexTrace<BigIndex>::ToNumber(newLen, scriptContext), scriptContext, PropertyOperation_ThrowIfNotExtensible)),
            h.ThrowTypeErrorOnFailure(JavascriptOperators::SetProperty(pNewObj, pNewObj, PropertyIds::length, IndexTrace<BigIndex>::ToNumber(deleteLen, scriptContext), scriptContext, PropertyOperation_ThrowIfNotExtensible)));
#ifdef VALIDATE_ARRAY
        if (pnewArr)
        {
            pnewArr->ValidateArray();
        }
#endif
        return pNewObj;
    }